

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroker_add_reverse_left(PVG_FT_Stroker stroker,PVG_FT_Bool open)

{
  PVG_FT_Vector *pPVar1;
  byte bVar2;
  PVG_FT_UInt new_points_00;
  PVG_FT_StrokeBorderRec *border;
  PVG_FT_StrokeBorderRec *pPVar3;
  PVG_FT_Byte *pPStack_50;
  PVG_FT_Byte ttag;
  PVG_FT_Byte *src_tag;
  PVG_FT_Vector *src_point;
  PVG_FT_Byte *dst_tag;
  PVG_FT_Vector *dst_point;
  PVG_FT_Error error;
  PVG_FT_Int new_points;
  PVG_FT_StrokeBorder left;
  PVG_FT_StrokeBorder right;
  PVG_FT_Bool open_local;
  PVG_FT_Stroker stroker_local;
  
  border = stroker->borders;
  pPVar3 = stroker->borders + 1;
  dst_point._0_4_ = 0;
  if (-1 < stroker->borders[1].start) {
    new_points_00 = pPVar3->num_points - stroker->borders[1].start;
    if ((0 < (int)new_points_00) &&
       (dst_point._0_4_ = ft_stroke_border_grow(border,new_points_00), (PVG_FT_Error)dst_point == 0)
       ) {
      dst_tag = (PVG_FT_Byte *)(stroker->borders[0].points + border->num_points);
      src_point = (PVG_FT_Vector *)(stroker->borders[0].tags + border->num_points);
      pPStack_50 = stroker->borders[1].tags + pPVar3->num_points;
      pPVar1 = stroker->borders[1].points + pPVar3->num_points;
      while( true ) {
        src_tag = (PVG_FT_Byte *)(pPVar1 + -1);
        pPStack_50 = pPStack_50 + -1;
        if (src_tag < stroker->borders[1].points + stroker->borders[1].start) break;
        *(undefined8 *)dst_tag = *(undefined8 *)src_tag;
        *(PVG_FT_Pos *)(dst_tag + 8) = pPVar1[-1].y;
        *(PVG_FT_Byte *)&src_point->x = *pPStack_50;
        if (open == '\0') {
          bVar2 = (byte)src_point->x & 0xc;
          if ((bVar2 == 4) || (bVar2 == 8)) {
            *(byte *)&src_point->x = (byte)src_point->x ^ 0xc;
          }
        }
        else {
          *(byte *)&src_point->x = (byte)src_point->x & 0xf3;
        }
        dst_tag = dst_tag + 0x10;
        src_point = (PVG_FT_Vector *)((long)&src_point->x + 1);
        pPVar1 = (PVG_FT_Vector *)src_tag;
      }
      pPVar3->num_points = stroker->borders[1].start;
      border->num_points = new_points_00 + border->num_points;
      stroker->borders[0].movable = '\0';
      stroker->borders[1].movable = '\0';
    }
    return (PVG_FT_Error)dst_point;
  }
  __assert_fail("left->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x5dc,"PVG_FT_Error ft_stroker_add_reverse_left(PVG_FT_Stroker, PVG_FT_Bool)");
}

Assistant:

static PVG_FT_Error ft_stroker_add_reverse_left(PVG_FT_Stroker stroker,
                                               PVG_FT_Bool    open)
{
    PVG_FT_StrokeBorder right = stroker->borders + 0;
    PVG_FT_StrokeBorder left = stroker->borders + 1;
    PVG_FT_Int          new_points;
    PVG_FT_Error        error = 0;

    assert(left->start >= 0);

    new_points = left->num_points - left->start;
    if (new_points > 0) {
        error = ft_stroke_border_grow(right, (PVG_FT_UInt)new_points);
        if (error) goto Exit;

        {
            PVG_FT_Vector* dst_point = right->points + right->num_points;
            PVG_FT_Byte*   dst_tag = right->tags + right->num_points;
            PVG_FT_Vector* src_point = left->points + left->num_points - 1;
            PVG_FT_Byte*   src_tag = left->tags + left->num_points - 1;

            while (src_point >= left->points + left->start) {
                *dst_point = *src_point;
                *dst_tag = *src_tag;

                if (open)
                    dst_tag[0] &= ~PVG_FT_STROKE_TAG_BEGIN_END;
                else {
                    PVG_FT_Byte ttag =
                        (PVG_FT_Byte)(dst_tag[0] & PVG_FT_STROKE_TAG_BEGIN_END);

                    /* switch begin/end tags if necessary */
                    if (ttag == PVG_FT_STROKE_TAG_BEGIN ||
                        ttag == PVG_FT_STROKE_TAG_END)
                        dst_tag[0] ^= PVG_FT_STROKE_TAG_BEGIN_END;
                }

                src_point--;
                src_tag--;
                dst_point++;
                dst_tag++;
            }
        }

        left->num_points = left->start;
        right->num_points += new_points;

        right->movable = FALSE;
        left->movable = FALSE;
    }

Exit:
    return error;
}